

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

bool duckdb::RLEAnalyze<unsigned_int>(AnalyzeState *state,Vector *input,idx_t count)

{
  idx_t idx;
  idx_t iVar1;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_70);
  if (count != 0) {
    iVar1 = 0;
    do {
      idx = iVar1;
      if ((local_70.sel)->sel_vector != (sel_t *)0x0) {
        idx = (idx_t)(local_70.sel)->sel_vector[iVar1];
      }
      RLEState<unsigned_int>::Update<duckdb::EmptyRLEWriter>
                ((RLEState<unsigned_int> *)(state + 1),(uint *)local_70.data,&local_70.validity,idx)
      ;
      iVar1 = iVar1 + 1;
    } while (count != iVar1);
  }
  if (local_70.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return true;
}

Assistant:

bool RLEAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &rle_state = state.template Cast<RLEAnalyzeState<T>>();
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		rle_state.state.Update(data, vdata.validity, idx);
	}
	return true;
}